

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

void __thiscall
icu_63::CollationBuilder::CollationBuilder
          (CollationBuilder *this,CollationTailoring *b,UErrorCode *errorCode)

{
  int32_t iVar1;
  CollationData *pCVar2;
  Normalizer2 *pNVar3;
  Normalizer2Impl *pNVar4;
  CollationDataBuilder *this_00;
  char *pcVar5;
  CollationTailoring *size;
  
  (this->super_Sink).super_UObject._vptr_UObject = (_func_int **)&PTR__CollationBuilder_003e81e0;
  size = b;
  pNVar3 = Normalizer2::getNFDInstance(errorCode);
  this->nfd = pNVar3;
  pNVar3 = Normalizer2Factory::getFCDInstance(errorCode);
  this->fcd = pNVar3;
  pNVar4 = Normalizer2Factory::getNFCImpl(errorCode);
  this->nfcImpl = pNVar4;
  this->base = b;
  pCVar2 = b->data;
  this->baseData = pCVar2;
  iVar1 = pCVar2->rootElementsLength;
  (this->rootElements).elements = pCVar2->rootElements;
  (this->rootElements).length = iVar1;
  this->variableTop = 0;
  this_00 = (CollationDataBuilder *)UMemory::operator_new((UMemory *)0x198,(size_t)size);
  if (this_00 == (CollationDataBuilder *)0x0) {
    this_00 = (CollationDataBuilder *)0x0;
  }
  else {
    CollationDataBuilder::CollationDataBuilder(this_00,errorCode);
  }
  this->dataBuilder = this_00;
  this->fastLatinEnabled = '\x01';
  UnicodeSet::UnicodeSet(&this->optimizeSet);
  this->errorReason = (char *)0x0;
  this->cesLength = 0;
  UVector32::UVector32(&this->rootPrimaryIndexes,errorCode);
  UVector64::UVector64(&this->nodes,errorCode);
  Normalizer2Impl::ensureCanonIterData(this->nfcImpl,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->dataBuilder == (CollationDataBuilder *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    CollationDataBuilder::initForTailoring(this->dataBuilder,this->baseData,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      return;
    }
    pcVar5 = "CollationBuilder initialization failed";
  }
  else {
    pcVar5 = "CollationBuilder fields initialization failed";
  }
  this->errorReason = pcVar5;
  return;
}

Assistant:

CollationBuilder::CollationBuilder(const CollationTailoring *b, UErrorCode &errorCode)
        : nfd(*Normalizer2::getNFDInstance(errorCode)),
          fcd(*Normalizer2Factory::getFCDInstance(errorCode)),
          nfcImpl(*Normalizer2Factory::getNFCImpl(errorCode)),
          base(b),
          baseData(b->data),
          rootElements(b->data->rootElements, b->data->rootElementsLength),
          variableTop(0),
          dataBuilder(new CollationDataBuilder(errorCode)), fastLatinEnabled(TRUE),
          errorReason(NULL),
          cesLength(0),
          rootPrimaryIndexes(errorCode), nodes(errorCode) {
    nfcImpl.ensureCanonIterData(errorCode);
    if(U_FAILURE(errorCode)) {
        errorReason = "CollationBuilder fields initialization failed";
        return;
    }
    if(dataBuilder == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    dataBuilder->initForTailoring(baseData, errorCode);
    if(U_FAILURE(errorCode)) {
        errorReason = "CollationBuilder initialization failed";
    }
}